

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O0

void __thiscall
JAMA::Eigenvalue<double>::cdiv(Eigenvalue<double> *this,double xr,double xi,double yr,double yi)

{
  long lVar1;
  int in_EDI;
  undefined4 in_register_0000003c;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double d;
  double r;
  
  lVar1 = CONCAT44(in_register_0000003c,in_EDI);
  std::abs(in_EDI);
  std::abs(in_EDI);
  if (extraout_XMM0_Qa <= extraout_XMM0_Qa_00) {
    dVar2 = in_XMM2_Qa / in_XMM3_Qa;
    dVar3 = dVar2 * in_XMM2_Qa + in_XMM3_Qa;
    *(double *)(lVar1 + 0x70) = (dVar2 * in_XMM0_Qa + in_XMM1_Qa) / dVar3;
    *(double *)(lVar1 + 0x78) = (dVar2 * in_XMM1_Qa + -in_XMM0_Qa) / dVar3;
  }
  else {
    dVar2 = in_XMM3_Qa / in_XMM2_Qa;
    dVar3 = dVar2 * in_XMM3_Qa + in_XMM2_Qa;
    *(double *)(lVar1 + 0x70) = (dVar2 * in_XMM1_Qa + in_XMM0_Qa) / dVar3;
    *(double *)(lVar1 + 0x78) = (-dVar2 * in_XMM0_Qa + in_XMM1_Qa) / dVar3;
  }
  return;
}

Assistant:

void cdiv(Real xr, Real xi, Real yr, Real yi) {
      Real r, d;
      if (abs(yr) > abs(yi)) {
        r     = yi / yr;
        d     = yr + r * yi;
        cdivr = (xr + r * xi) / d;
        cdivi = (xi - r * xr) / d;
      } else {
        r     = yr / yi;
        d     = yi + r * yr;
        cdivr = (r * xr + xi) / d;
        cdivi = (r * xi - xr) / d;
      }
    }